

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O3

bool __thiscall
cmDyndepCollation::WriteDyndepMetadata
          (cmDyndepCollation *this,string *lang,
          vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *objects,
          cmCxxModuleExportInfo *export_info,cmDyndepMetadataCallbacks *cb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  _Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_> this_00;
  ostream *poVar7;
  cmGeneratedFileStream *this_01;
  const_iterator cVar8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_02;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar9;
  const_iterator cVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  string *extraout_RDX;
  string *psVar13;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  string *extraout_RDX_05;
  string *extraout_RDX_06;
  string *extraout_RDX_07;
  string *extraout_RDX_08;
  string *extraout_RDX_09;
  string *extraout_RDX_10;
  string *extraout_RDX_11;
  string *extraout_RDX_12;
  string *extraout_RDX_13;
  string *extraout_RDX_14;
  string *extraout_RDX_15;
  string *extraout_RDX_16;
  string *extraout_RDX_17;
  string *extraout_RDX_18;
  byte bVar14;
  cmSourceReqInfo *p;
  _Base_ptr p_Var15;
  cmSourceReqInfo *r;
  _Base_ptr p_Var16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  undefined8 uVar19;
  cmCxxModuleExportInfo *pcVar20;
  pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>
  *exp;
  undefined8 uVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar25;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string bmi_path;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> m;
  string iface_source;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dest_1;
  string bmi_destination;
  vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
  exports;
  string build_bmi_path;
  string install_bmi_path;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  private_modules;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  public_source_requires;
  string output_path;
  string config_upper;
  undefined1 local_378 [32];
  undefined1 *local_358;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  undefined4 local_334;
  string local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  string *local_308;
  _Base_ptr local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  string *local_2f0;
  _Base_ptr local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  pointer local_2d0;
  pointer local_2c8;
  undefined8 local_2c0;
  _Base_ptr local_2b8;
  _Base_ptr local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined8 local_290;
  _Base_ptr local_288;
  undefined1 local_280 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  string local_258;
  undefined1 local_238 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  string *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined8 local_1d8;
  cmCxxModuleExportInfo *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined1 local_180 [24];
  undefined1 local_168 [8];
  _Base_ptr local_160;
  size_t local_158;
  undefined1 local_148 [32];
  _Rb_tree_node_base *local_128;
  size_t local_120;
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer *local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr *local_78;
  string local_70;
  string local_50;
  
  bVar14 = 1;
  if ((*(long *)(this + 8) == 3) &&
     ((char)(*(short **)this)[1] == 'X' && **(short **)this == 0x5843)) {
    local_210 = lang;
    local_1c8 = export_info;
    cmsys::SystemTools::UpperCase
              (&local_70,
               (string *)
               &objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )0x0;
    local_1d8 = 0;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (paVar22 != local_340) {
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_378 + 0x18);
      do {
        local_280._0_8_ =
             (__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)
             0x0;
        local_330._M_string_length =
             *(size_type *)&((_Base_ptr)(paVar22->_M_local_buf + 0x40))->_M_color;
        local_330._M_dataplus._M_p = *(pointer *)(paVar22->_M_local_buf + 0x48);
        local_330.field_2._M_allocated_capacity = 0;
        local_378._0_8_ = (pointer)0x0;
        local_378._8_8_ = (char *)0x1;
        local_378[0x18] = '/';
        local_330.field_2._8_8_ = 1;
        local_308 = (string *)0x0;
        local_2f8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)&((_Base_ptr)(paVar22->_M_local_buf + 0x60))->_M_color;
        local_300 = (_Base_ptr)(((pointer)((long)paVar22 + 0x68))->PrimaryOutput)._M_dataplus._M_p;
        local_2f0 = (string *)0x0;
        local_180._0_8_ = (pointer)0x0;
        local_180._8_8_ = 1;
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168;
        local_168[0] = 0x2f;
        local_2e8 = (_Base_ptr)0x1;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        views._M_len = 4;
        views._M_array = (iterator)&local_330;
        local_378._16_8_ = paVar1;
        local_310 = paVar1;
        local_180._16_8_ = local_2e0;
        cmCatViews((string *)local_148,views);
        local_330._M_dataplus._M_p = (pointer)CONCAT44(local_148._12_4_,local_148._8_4_);
        local_330._M_string_length = local_148._0_8_;
        local_330.field_2._M_allocated_capacity = 0;
        local_330.field_2._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x7;
        local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x80df3f;
        local_308 = (string *)0x0;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)paVar22->_M_allocated_capacity;
        local_300 = *(_Base_ptr *)((long)paVar22 + 8);
        local_2f0 = (string *)0x0;
        local_378._0_8_ = (char *)0x0;
        local_378._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
        local_378[0x18] = 0x2d;
        local_2e8 = (_Base_ptr)0x1;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_2c8 = objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        local_2d0 = objects[10].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2c0 = 0;
        local_2b8 = (_Base_ptr)&DAT_00000006;
        local_2b0 = (_Base_ptr)0x7e3b96;
        local_2a8 = 0;
        views_00._M_len = 6;
        views_00._M_array = (iterator)&local_330;
        local_378._16_8_ = paVar1;
        local_2e0 = paVar1;
        cmCatViews((string *)local_180,views_00);
        this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
             (_Head_base<0UL,_cmGeneratedFileStream_*,_false>)operator_new(0x268);
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)
                   this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                   (string *)local_180,false,None);
        if ((cmGeneratedFileStream *)local_280._0_8_ != (cmGeneratedFileStream *)0x0) {
          lVar2 = *(long *)local_280._0_8_;
          local_280._0_8_ =
               this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          (**(code **)(lVar2 + 8))();
          this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
               (_Head_base<0UL,_cmGeneratedFileStream_*,_false>)
               (_Head_base<0UL,_cmGeneratedFileStream_*,_false>)local_280._0_8_;
        }
        local_280._0_8_ = this_00.super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl
        ;
        uVar21 = local_280._0_8_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_280._0_8_,"set_property(TARGET \"",0x15);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)uVar21,
                            *(char **)((long)&(((pointer)((long)paVar22 + 0x68))->PrimaryOutput).
                                              field_2 + 8),
                            (long)(((pointer)((long)paVar22 + 0x68))->ExtraOutputs).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)paVar22->_M_allocated_capacity,
                            (long)*(_Base_ptr *)((long)paVar22 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"  PROPERTY IMPORTED_CXX_MODULES_",0x20);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
        local_330._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_330,1);
        local_330._M_dataplus._M_p = (pointer)paVar22;
        std::
        vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
        ::
        emplace_back<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>
                  ((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>,std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>,CxxModuleExport_const*>>>
                    *)local_1e8._M_local_buf,
                   (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *
                   )local_280,(CxxModuleExport **)&local_330);
        if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
          operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        if ((cmGeneratedFileStream *)local_280._0_8_ != (cmGeneratedFileStream *)0x0) {
          (**(code **)(*(long *)local_280._0_8_ + 8))();
        }
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(((pointer)((long)paVar22 + 0x68))->Provides).
                      super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                      super__Vector_impl_data._M_finish;
      } while (paVar22 != local_340);
    }
    psVar13 = local_210;
    if (*(char *)&objects[9].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start == '\0') {
      this_01 = (cmGeneratedFileStream *)0x0;
    }
    else {
      this_01 = (cmGeneratedFileStream *)operator_new(0x268);
      cmGeneratedFileStream::cmGeneratedFileStream
                (this_01,(string *)
                         &objects[7].
                          super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,false,None);
    }
    local_168 = (undefined1  [8])(local_180 + 8);
    local_180._8_8_ = local_180._8_8_ & 0xffffffff00000000;
    local_180._16_8_ = 0;
    local_158 = 0;
    local_148._24_8_ = local_148 + 8;
    local_148._8_4_ = _S_red;
    local_148._16_8_ = 0;
    local_120 = 0;
    p_Var16 = (_Base_ptr)(psVar13->_M_dataplus)._M_p;
    local_88 = (_Base_ptr)psVar13->_M_string_length;
    local_160 = (_Base_ptr)local_168;
    local_128 = (_Rb_tree_node_base *)local_148._24_8_;
    if (p_Var16 == local_88) {
      local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_340._4_4_,(int)CONCAT71((int7)((ulong)local_88 >> 8),1));
    }
    else {
      local_90 = (_Base_ptr)
                 &(objects->super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      local_98 = &objects[3].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      paVar22 = &local_330.field_2;
      local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_340._4_4_,(int)CONCAT71((int7)((ulong)local_98 >> 8),1));
      pcVar20 = local_1c8;
      do {
        local_f8._M_allocated_capacity = (size_type)&local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,*(long *)p_Var16,
                   (long)&p_Var16->_M_parent->_M_color + *(long *)p_Var16);
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleFileSet>_>_>
                        *)objects,(key_type *)&local_f8);
        p_Var15 = p_Var16[1]._M_right;
        p_Var3 = *(_Base_ptr *)(p_Var16 + 2);
        if (cVar8._M_node == local_90) {
          if (p_Var15 != p_Var3) {
            local_330._M_dataplus._M_p = (pointer)0x7;
            local_330._M_string_length = 0x80ccdb;
            local_330.field_2._M_allocated_capacity = 0;
            local_310 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)p_Var16;
            local_330.field_2._8_8_ = p_Var16->_M_parent;
            local_308 = (string *)0x0;
            local_300 = (_Base_ptr)0xf;
            local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x80d098;
            local_2f0 = (string *)0x0;
            local_2e0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)p_Var15;
            local_2e8 = p_Var15->_M_parent;
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_2d0 = (pointer)0x42;
            local_2c8 = (pointer)0x80d0a8;
            local_2c0 = 0;
            views_02._M_len = 5;
            views_02._M_array = (iterator)&local_330;
            cmCatViews((string *)local_378,views_02);
            cmSystemTools::Error((string *)local_378);
LAB_0041a263:
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
            }
            local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)local_340 & 0xffffffff00000000);
          }
        }
        else {
          p_Var4 = cVar8._M_node[5]._M_parent;
          p_Var5 = cVar8._M_node[5]._M_left;
          if (p_Var5 == (_Base_ptr)0x12) {
            auVar23[0] = -((char)p_Var4->_M_color == 'C');
            auVar23[1] = -(*(byte *)((long)&p_Var4->_M_color + 1) == 'X');
            auVar23[2] = -(*(byte *)((long)&p_Var4->_M_color + 2) == 'X');
            auVar23[3] = -(*(byte *)((long)&p_Var4->_M_color + 3) == '_');
            auVar23[4] = -(p_Var4->field_0x4 == 'M');
            auVar23[5] = -(p_Var4->field_0x5 == 'O');
            auVar23[6] = -(p_Var4->field_0x6 == 'D');
            auVar23[7] = -(p_Var4->field_0x7 == 'U');
            auVar23[8] = -(*(char *)&p_Var4->_M_parent == 'L');
            auVar23[9] = -(*(char *)((long)&p_Var4->_M_parent + 1) == 'E');
            auVar23[10] = -(*(char *)((long)&p_Var4->_M_parent + 2) == '_');
            auVar23[0xb] = -(*(char *)((long)&p_Var4->_M_parent + 3) == 'H');
            auVar23[0xc] = -(*(char *)((long)&p_Var4->_M_parent + 4) == 'E');
            auVar23[0xd] = -(*(char *)((long)&p_Var4->_M_parent + 5) == 'A');
            auVar23[0xe] = -(*(char *)((long)&p_Var4->_M_parent + 6) == 'D');
            auVar23[0xf] = -(*(char *)((long)&p_Var4->_M_parent + 7) == 'E');
            auVar24[0] = -((char)*(undefined2 *)&p_Var4->_M_left == 'R');
            auVar24[1] = -((char)((ushort)*(undefined2 *)&p_Var4->_M_left >> 8) == 'S');
            auVar24[2] = 0xff;
            auVar24[3] = 0xff;
            auVar24[4] = 0xff;
            auVar24[5] = 0xff;
            auVar24[6] = 0xff;
            auVar24[7] = 0xff;
            auVar24[8] = 0xff;
            auVar24[9] = 0xff;
            auVar24[10] = 0xff;
            auVar24[0xb] = 0xff;
            auVar24[0xc] = 0xff;
            auVar24[0xd] = 0xff;
            auVar24[0xe] = 0xff;
            auVar24[0xf] = 0xff;
            auVar24 = auVar24 & auVar23;
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0041a15e;
          }
          else {
            if ((p_Var5 != (_Base_ptr)0xb) ||
               (cb = (cmDyndepMetadataCallbacks *)
                     (*(ulong *)((long)&p_Var4->_M_color + 3) ^ 0x53454c55444f4d5f |
                     *(ulong *)p_Var4 ^ 0x55444f4d5f585843), cb != (cmDyndepMetadataCallbacks *)0x0)
               ) {
LAB_0041a15e:
              if (p_Var15 != p_Var3) {
                local_330._M_dataplus._M_p = (pointer)0x7;
                local_330._M_string_length = 0x80d152;
                cb = (cmDyndepMetadataCallbacks *)0x0;
                local_330.field_2._M_allocated_capacity = 0;
                local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)cVar8._M_node[4]._M_parent;
                local_330.field_2._8_8_ = cVar8._M_node[4]._M_left;
                local_308 = (string *)0x0;
                local_300 = (_Base_ptr)0xf;
                local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x80d098;
                local_2f0 = (string *)0x0;
                local_2e0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              **)p_Var15;
                local_2e8 = p_Var15->_M_parent;
                local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                local_2d0 = (pointer)0x1d;
                local_2c8 = (pointer)0x80d15a;
                local_2c0 = 0;
                local_2a8 = 0;
                local_2a0 = 0x2a;
                local_298 = "` module but must be of type `CXX_MODULES`";
                local_290 = 0;
                views_03._M_len = 7;
                views_03._M_array = (iterator)&local_330;
                local_2b8 = p_Var5;
                local_2b0 = p_Var4;
                cmCatViews((string *)local_378,views_03);
                cmSystemTools::Error((string *)local_378);
                goto LAB_0041a263;
              }
              goto LAB_0041a287;
            }
            if (p_Var15 == p_Var3) {
              local_330._M_dataplus._M_p = (pointer)0x7;
              local_330._M_string_length = 0x80ccdb;
              local_330.field_2._M_allocated_capacity = 0;
              local_310 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            **)p_Var16;
              local_330.field_2._8_8_ = p_Var16->_M_parent;
              local_308 = (string *)0x0;
              local_300 = (_Base_ptr)0x53;
              local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x80d0eb;
              local_2f0 = (string *)0x0;
              views_01._M_len = 3;
              views_01._M_array = (iterator)&local_330;
              cmCatViews((string *)local_378,views_01);
              cmSystemTools::Error((string *)local_378);
              goto LAB_0041a263;
            }
          }
          bVar6 = cmFileSetVisibilityIsForInterface
                            (*(cmFileSetVisibility *)&cVar8._M_node[6]._M_parent);
          local_288 = p_Var16;
          if (bVar6) {
            local_210 = (string *)&cVar8._M_node[4]._M_parent;
            this_02 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                       *)local_148,local_210);
            p_Var15 = local_288[2]._M_right;
            psVar13 = extraout_RDX;
            for (p_Var16 = local_288[2]._M_left; p_Var16 != p_Var15;
                p_Var16 = (_Base_ptr)&p_Var16[3]._M_parent) {
              pVar25 = std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)p_Var16);
              psVar13 = pVar25._8_8_;
            }
            p_Var15 = local_288[1]._M_right;
            local_80 = *(_Base_ptr *)(local_288 + 2);
            p_Var16 = local_288;
            if (p_Var15 != local_80) {
              local_78 = &cVar8._M_node[6]._M_left;
              do {
                local_208 = &local_1f8;
                local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                local_1f8._M_local_buf[0] = '\0';
                if (*(char *)&objects[9].
                              super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                              _M_impl.super__Vector_impl_data._M_start == '\x01') {
                  ppVar9 = WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                           ::$_1::operator()::string_const___const
                                     ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_280,local_98,psVar13);
                  local_334 = (undefined4)CONCAT71((int7)((ulong)ppVar9 >> 8),local_280[0]);
                  local_378._0_8_ = local_280._16_8_;
                  local_378._8_8_ = local_280._8_8_;
                  local_378._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_330._M_dataplus._M_p = (pointer)0x0;
                  local_330._M_string_length = 1;
                  local_358 = (undefined1 *)((long)&local_330.field_2 + 8);
                  local_330.field_2._M_local_buf[8] = 0x2f;
                  local_378._24_8_ = 1;
                  local_350 = 0;
                  views_04._M_len = 2;
                  views_04._M_array = (iterator)local_378;
                  local_330.field_2._M_allocated_capacity = (size_type)local_358;
                  cmCatViews((string *)local_238,views_04);
                  std::__cxx11::string::operator=((string *)&local_208,(string *)local_238);
                  if ((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]) != local_238 + 0x10) {
                    operator_delete((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]),
                                    (ulong)(local_238._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._8_8_ != &local_268) {
                    operator_delete((void *)local_280._8_8_,local_268._M_allocated_capacity + 1);
                  }
                }
                else {
                  local_334 = 0;
                }
                local_1a0 = &local_190;
                local_198 = 0;
                local_190 = 0;
                local_1c0 = &local_1b0;
                local_1b8 = 0;
                local_1b0 = 0;
                if ((pcVar20->ObjectToFileSet)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent == (_Base_ptr)0x0) {
                  std::__throw_bad_function_call();
                }
                (*(code *)(pcVar20->ObjectToFileSet)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left)(local_280,pcVar20,p_Var15);
                psVar13 = extraout_RDX_00;
                if (local_268._M_local_buf[8] == '\x01') {
                  cmsys::SystemTools::GetFilenameName(&local_258,(string *)local_280);
                  str._M_str = (char *)0x1;
                  str._M_len = (size_t)local_258._M_dataplus._M_p;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            ((string *)local_238,(cmOutputConverter *)local_258._M_string_length,str
                             ,(WrapQuotes)cb);
                  local_330._M_dataplus._M_p = (pointer)local_200;
                  local_330._M_string_length = (size_type)local_208;
                  local_330.field_2._M_allocated_capacity = 0;
                  local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_238._1_7_,local_238[0]);
                  local_330.field_2._8_8_ = local_238._8_8_;
                  views_05._M_len = 2;
                  views_05._M_array = (iterator)&local_330;
                  local_308 = (string *)local_238;
                  cmCatViews((string *)local_378,views_05);
                  std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_378);
                  if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                    operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                  }
                  if ((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]) != local_238 + 0x10) {
                    operator_delete((undefined1 *)CONCAT71(local_238._1_7_,local_238[0]),
                                    (ulong)(local_238._16_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                    operator_delete(local_258._M_dataplus._M_p,
                                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                             local_258.field_2._M_local_buf[0]) + 1);
                  }
                  str_00._M_str = (char *)0x1;
                  str_00._M_len = local_280._0_8_;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&local_330,(cmOutputConverter *)local_280._8_8_,str_00,(WrapQuotes)cb);
                  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_330);
                  psVar13 = extraout_RDX_01;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != paVar22) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    (ulong)(local_330.field_2._M_allocated_capacity + 1));
                    psVar13 = extraout_RDX_02;
                  }
                }
                uVar21 = local_1e8._8_8_;
                for (uVar19 = local_1e8._M_allocated_capacity; pcVar20 = local_1c8, uVar19 != uVar21
                    ; uVar19 = uVar19 + 0x10) {
                  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                  local_258._M_string_length = 0;
                  local_258.field_2._M_local_buf[0] = '\0';
                  if ((*(char *)(*(undefined8 *)(uVar19 + 8) + 0xa0) == '\x01') &&
                     (*(char *)&cVar8._M_node[7]._M_left == '\x01')) {
                    WriteDyndepMetadata(std::__cxx11::string_const&,std::vector<cmScanDepInfo,std::allocator<cmScanDepInfo>>const&,cmCxxModuleExportInfo_const&,cmDyndepMetadataCallbacks_const&)
                    ::$_1::operator()::string_const___const
                              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_238,local_78,psVar13);
                    str_01._M_str = (char *)0x1;
                    str_01._M_len = (size_t)cVar8._M_node[3]._M_parent;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&local_118,(cmOutputConverter *)cVar8._M_node[3]._M_left,str_01,
                               (WrapQuotes)cb);
                    cmsys::SystemTools::GetFilenameName((string *)&local_d8,local_210);
                    str_02._M_str = (char *)0x1;
                    str_02._M_len = local_d8._M_allocated_capacity;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)&local_b8,(cmOutputConverter *)local_d8._8_8_,str_02,
                               (WrapQuotes)cb);
                    local_330._M_dataplus._M_p = (pointer)local_238._16_8_;
                    local_330._M_string_length = local_238._8_8_;
                    local_330.field_2._M_allocated_capacity = 0;
                    local_378._0_8_ = (char *)0x0;
                    local_378._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    local_378._16_8_ = local_378 + 0x18;
                    local_378[0x18] = 0x2f;
                    local_330.field_2._8_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    local_308 = (string *)0x0;
                    local_300 = (_Base_ptr)local_118._M_string_length;
                    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_118._M_dataplus._M_p;
                    local_2f0 = &local_118;
                    local_2e8 = (_Base_ptr)local_b8._8_8_;
                    local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_b8._M_allocated_capacity;
                    views_06._M_len = 4;
                    views_06._M_array = (iterator)&local_330;
                    local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_378._16_8_;
                    local_2d8 = &local_b8;
                    cmCatViews(&local_50,views_06);
                    std::__cxx11::string::operator=((string *)&local_258,(string *)&local_50);
                    psVar13 = extraout_RDX_03;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                      psVar13 = extraout_RDX_04;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_allocated_capacity != &local_a8) {
                      operator_delete((void *)local_b8._M_allocated_capacity,
                                      local_a8._M_allocated_capacity + 1);
                      psVar13 = extraout_RDX_05;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_allocated_capacity != &local_c8) {
                      operator_delete((void *)local_d8._M_allocated_capacity,
                                      local_c8._M_allocated_capacity + 1);
                      psVar13 = extraout_RDX_06;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                      psVar13 = extraout_RDX_07;
                    }
                    uVar17 = local_220._0_8_;
                    _Var18._M_p = (pointer)local_238._8_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._8_8_ != &local_220) {
LAB_0041a8eb:
                      operator_delete(_Var18._M_p,(ulong)(uVar17 + 1));
                      psVar13 = extraout_RDX_09;
                    }
                  }
                  else {
                    str_03._M_str = (char *)0x1;
                    str_03._M_len = (size_t)cVar8._M_node[4]._M_parent;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&local_330,(cmOutputConverter *)cVar8._M_node[4]._M_left,str_03,
                               (WrapQuotes)cb);
                    std::__cxx11::string::operator=((string *)&local_258,(string *)&local_330);
                    psVar13 = extraout_RDX_08;
                    uVar17 = local_330.field_2._M_allocated_capacity;
                    _Var18._M_p = local_330._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p != paVar22) goto LAB_0041a8eb;
                  }
                  local_330._M_string_length = 0;
                  local_330.field_2._M_allocated_capacity =
                       local_330.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_330._M_dataplus._M_p = (pointer)paVar22;
                  if ((*(char *)(*(undefined8 *)(uVar19 + 8) + 0xa0) != '\x01') ||
                     (*(char *)&objects[9].
                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                _M_impl.super__Vector_impl_data._M_start != '\0')) {
                    std::__cxx11::string::_M_assign((string *)&local_330);
                    psVar13 = extraout_RDX_10;
                  }
                  if ((cmOutputConverter *)local_258._M_string_length != (cmOutputConverter *)0x0) {
                    poVar7 = *(ostream **)uVar19;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    \"",5);
                    str_04._M_str = (char *)0x1;
                    str_04._M_len = *(size_t *)p_Var15;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              ((string *)local_378,(cmOutputConverter *)p_Var15->_M_parent,str_04,
                               (WrapQuotes)cb);
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar7,(char *)local_378._0_8_,local_378._8_8_);
                    local_238[0] = 0x3d;
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_238,1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,local_258._M_dataplus._M_p,local_258._M_string_length);
                    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                      operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_string_length !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      local_378[0] = 0x2c;
                      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                         (*(ostream **)uVar19,local_378,1);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar7,local_330._M_dataplus._M_p,local_330._M_string_length);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>(*(ostream **)uVar19,"\"\n",2)
                    ;
                    psVar13 = extraout_RDX_11;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != paVar22) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    (ulong)(local_330.field_2._M_allocated_capacity + 1));
                    psVar13 = extraout_RDX_12;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p != &local_258.field_2) {
                    operator_delete(local_258._M_dataplus._M_p,
                                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                             local_258.field_2._M_local_buf[0]) + 1);
                    psVar13 = extraout_RDX_13;
                  }
                }
                if (this_01 != (cmGeneratedFileStream *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"if (CMAKE_INSTALL_COMPONENT STREQUAL \"",0x26);
                  str_05._M_str = (char *)0x1;
                  str_05._M_len =
                       (size_t)objects[2].
                               super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&local_330,
                             (cmOutputConverter *)
                             objects[2].
                             super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                             _M_impl.super__Vector_impl_data._M_finish,str_05,(WrapQuotes)cb);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)this_01,local_330._M_dataplus._M_p,
                                      local_330._M_string_length);
                  local_378[0] = 0x22;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_378,1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != paVar22) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    (ulong)(local_330.field_2._M_allocated_capacity + 1));
                  }
                  if (*(char *)&objects[4].
                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01," OR NOT CMAKE_INSTALL_COMPONENT",0x1f);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")\n",2);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"  file(INSTALL\n    DESTINATION \"",0x20);
                  if ((char)local_334 == '\0') {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"${CMAKE_INSTALL_PREFIX}/",0x18);
                  }
                  str_06._M_str = (char *)0x1;
                  str_06._M_len =
                       (size_t)objects[3].
                               super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                  cmOutputConverter::EscapeForCMake_abi_cxx11_
                            (&local_330,
                             (cmOutputConverter *)
                             objects[3].
                             super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,str_06,(WrapQuotes)cb
                            );
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)this_01,local_330._M_dataplus._M_p,
                                      local_330._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"\"\n    TYPE FILE\n",0x10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != paVar22) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    (ulong)(local_330.field_2._M_allocated_capacity + 1));
                  }
                  if (*(char *)((long)&objects[4].
                                       super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) ==
                      '\x01') {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"    OPTIONAL\n",0xd);
                  }
                  if (objects[6].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"    ",4);
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)this_01,
                                        (char *)objects[6].
                                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_finish,
                                        (long)objects[6].
                                              super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  }
                  if (objects[5].super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,"    PERMISSIONS",0xf);
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)this_01,
                                        (char *)objects[5].
                                                super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                        (long)objects[5].
                                              super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"    FILES \"",0xb);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)this_01,(char *)local_280._0_8_,local_280._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
                  if ((char)local_334 != '\0') {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_01,
                               "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n    \"",0x34);
                    cmsys::SystemTools::GetFilenameName((string *)local_378,(string *)local_280);
                    str_07._M_str = (char *)0x1;
                    str_07._M_len = local_378._0_8_;
                    cmOutputConverter::EscapeForCMake_abi_cxx11_
                              (&local_330,(cmOutputConverter *)local_378._8_8_,str_07,(WrapQuotes)cb
                              );
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)this_01,local_330._M_dataplus._M_p,
                                        local_330._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar7,
                               "\")\n  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(WARNING\n      \"ABSOLUTE path INSTALL DESTINATION : ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n    message(FATAL_ERROR\n      \"ABSOLUTE path INSTALL DESTINATION forbidden (by caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n  endif ()\n"
                               ,0x161);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_330._M_dataplus._M_p != paVar22) {
                      operator_delete(local_330._M_dataplus._M_p,
                                      (ulong)(local_330.field_2._M_allocated_capacity + 1));
                    }
                    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                      operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
                    }
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_01,"endif ()\n",9);
                  psVar13 = extraout_RDX_14;
                }
                if ((local_268._M_local_buf[8] == '\x01') &&
                   (local_268._M_local_buf[8] = '\0',
                   (cmGeneratedFileStream *)local_280._0_8_ !=
                   (cmGeneratedFileStream *)(local_280 + 0x10))) {
                  operator_delete((void *)local_280._0_8_,(ulong)(local_280._16_8_ + 1));
                  psVar13 = extraout_RDX_15;
                }
                if (local_1c0 != &local_1b0) {
                  operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
                  psVar13 = extraout_RDX_16;
                }
                if (local_1a0 != &local_190) {
                  operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
                  psVar13 = extraout_RDX_17;
                }
                if (local_208 != &local_1f8) {
                  operator_delete(local_208,
                                  CONCAT71(local_1f8._M_allocated_capacity._1_7_,
                                           local_1f8._M_local_buf[0]) + 1);
                  psVar13 = extraout_RDX_18;
                }
                p_Var15 = (_Base_ptr)&p_Var15[3]._M_parent;
                p_Var16 = local_288;
              } while (p_Var15 != local_80);
            }
          }
          else {
            p_Var3 = *(_Base_ptr *)(p_Var16 + 2);
            for (p_Var15 = p_Var16[1]._M_right; p_Var16 = local_288, p_Var15 != p_Var3;
                p_Var15 = (_Base_ptr)&p_Var15[3]._M_parent) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_180,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         p_Var15);
            }
          }
        }
LAB_0041a287:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_allocated_capacity != &local_e8) {
          operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1)
          ;
        }
        p_Var16 = (_Base_ptr)&p_Var16[3]._M_parent;
      } while (p_Var16 != local_88);
    }
    uVar19 = local_1e8._8_8_;
    p_Var12 = (_Rb_tree_node_base *)local_148._24_8_;
    for (uVar21 = local_1e8._M_allocated_capacity; local_148._24_8_ = p_Var12, uVar21 != uVar19;
        uVar21 = uVar21 + 0x10) {
      std::__ostream_insert<char,std::char_traits<char>>(*(ostream **)uVar21,")\n",2);
      p_Var12 = (_Rb_tree_node_base *)local_148._24_8_;
    }
    if (p_Var12 != (_Rb_tree_node_base *)(local_148 + 8)) {
      do {
        for (p_Var11 = p_Var12[2]._M_right; p_Var11 != (_Rb_tree_node_base *)&p_Var12[2]._M_parent;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_180,(key_type *)(p_Var11 + 1));
          if (cVar10._M_node != (_Base_ptr)(local_180 + 8)) {
            local_330._M_dataplus._M_p = (pointer)0x1a;
            local_330._M_string_length = 0x80d3f6;
            local_330.field_2._M_allocated_capacity = 0;
            local_310 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)(p_Var12 + 1);
            local_330.field_2._8_8_ = p_Var12[1]._M_parent;
            local_308 = (string *)0x0;
            local_300 = (_Base_ptr)0x10;
            local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x80d411;
            local_2f0 = (string *)0x0;
            local_2e0 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          **)(p_Var11 + 1);
            local_2e8 = p_Var11[1]._M_parent;
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            local_2d0 = (pointer)0x32;
            local_2c8 = (pointer)0x80d422;
            local_2c0 = 0;
            views_07._M_len = 5;
            views_07._M_array = (iterator)&local_330;
            cmCatViews((string *)local_378,views_07);
            cmSystemTools::Error((string *)local_378);
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_,(ulong)(local_378._16_8_ + 1));
            }
            local_340 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)local_340 & 0xffffffff00000000);
          }
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)(local_148 + 8));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_148);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180);
    if (this_01 != (cmGeneratedFileStream *)0x0) {
      (*(this_01->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    std::
    vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
    ::~vector((vector<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>,_std::allocator<std::pair<std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_const_CxxModuleExport_*>_>_>
               *)&local_1e8);
    bVar14 = (byte)local_340;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool cmDyndepCollation::WriteDyndepMetadata(
  std::string const& lang, std::vector<cmScanDepInfo> const& objects,
  cmCxxModuleExportInfo const& export_info,
  cmDyndepMetadataCallbacks const& cb)
{
  // Only C++ supports any of the file-set or BMI installation considered
  // below.
  if (lang != "CXX"_s) {
    return true;
  }

  bool result = true;

  // Prepare the export information blocks.
  std::string const config_upper =
    cmSystemTools::UpperCase(export_info.Config);
  std::vector<
    std::pair<std::unique_ptr<cmGeneratedFileStream>, CxxModuleExport const*>>
    exports;
  for (auto const& exp : export_info.Exports) {
    std::unique_ptr<cmGeneratedFileStream> properties;

    std::string const export_dir =
      cmStrCat(exp.Prefix, '/', exp.CxxModuleInfoDir, '/');
    std::string const property_file_path = cmStrCat(
      export_dir, "target-", exp.Name, '-', export_info.Config, ".cmake");
    properties = cm::make_unique<cmGeneratedFileStream>(property_file_path);

    // Set up the preamble.
    *properties << "set_property(TARGET \"" << exp.Namespace << exp.Name
                << "\"\n"
                << "  PROPERTY IMPORTED_CXX_MODULES_" << config_upper << '\n';

    exports.emplace_back(std::move(properties), &exp);
  }

  std::unique_ptr<cmGeneratedFileStream> bmi_install_script;
  if (export_info.BmiInstallation) {
    bmi_install_script = cm::make_unique<cmGeneratedFileStream>(
      export_info.BmiInstallation->ScriptLocation);
  }

  auto cmEscape = [](cm::string_view str) {
    return cmOutputConverter::EscapeForCMake(
      str, cmOutputConverter::WrapQuotes::NoWrap);
  };
  auto install_destination =
    [&cmEscape](std::string const& dest) -> std::pair<bool, std::string> {
    if (cmSystemTools::FileIsFullPath(dest)) {
      return std::make_pair(true, cmEscape(dest));
    }
    return std::make_pair(false,
                          cmStrCat("${_IMPORT_PREFIX}/", cmEscape(dest)));
  };

  // public/private requirement tracking.
  std::set<std::string> private_modules;
  std::map<std::string, std::set<std::string>> public_source_requires;

  for (cmScanDepInfo const& object : objects) {
    // Convert to forward slashes.
    auto output_path = object.PrimaryOutput;
#ifdef _WIN32
    cmSystemTools::ConvertToUnixSlashes(output_path);
#endif
    // Find the fileset for this object.
    auto fileset_info_itr = export_info.ObjectToFileSet.find(output_path);
    bool const has_provides = !object.Provides.empty();
    if (fileset_info_itr == export_info.ObjectToFileSet.end()) {
      // If it provides anything, it should have type `CXX_MODULES`
      // and be present.
      if (has_provides) {
        // Take the first module provided to provide context.
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput, " provides the `",
                   provides.LogicalName,
                   "` module but it is not found in a `FILE_SET` of type "
                   "`CXX_MODULES`"));
        result = false;
      }

      // This object file does not provide anything, so nothing more needs to
      // be done.
      continue;
    }

    auto const& file_set = fileset_info_itr->second;

    // Verify the fileset type for the object.
    if (file_set.Type == "CXX_MODULES"_s) {
      if (!has_provides) {
        cmSystemTools::Error(
          cmStrCat("Output ", object.PrimaryOutput,
                   " is of type `CXX_MODULES` but does not provide a module "
                   "interface unit or partition"));
        result = false;
        continue;
      }
    } else if (file_set.Type == "CXX_MODULE_HEADERS"_s) {
      // TODO.
    } else {
      if (has_provides) {
        auto const& provides = object.Provides[0];
        cmSystemTools::Error(cmStrCat(
          "Source ", file_set.SourcePath, " provides the `",
          provides.LogicalName, "` C++ module but is of type `", file_set.Type,
          "` module but must be of type `CXX_MODULES`"));
        result = false;
      }

      // Not a C++ module; ignore.
      continue;
    }

    if (!cmFileSetVisibilityIsForInterface(file_set.Visibility)) {
      // Nothing needs to be conveyed about non-`PUBLIC` modules.
      for (auto const& p : object.Provides) {
        private_modules.insert(p.LogicalName);
      }
      continue;
    }

    // The module is public. Record what it directly requires.
    {
      auto& reqs = public_source_requires[file_set.SourcePath];
      for (auto const& r : object.Requires) {
        reqs.insert(r.LogicalName);
      }
    }

    // Write out properties and install rules for any exports.
    for (auto const& p : object.Provides) {
      bool bmi_dest_is_abs = false;
      std::string bmi_destination;
      if (export_info.BmiInstallation) {
        auto dest =
          install_destination(export_info.BmiInstallation->Destination);
        bmi_dest_is_abs = dest.first;
        bmi_destination = cmStrCat(dest.second, '/');
      }

      std::string install_bmi_path;
      std::string build_bmi_path;
      auto m = cb.ModuleFile(p.LogicalName);
      if (m) {
        install_bmi_path = cmStrCat(
          bmi_destination, cmEscape(cmSystemTools::GetFilenameName(*m)));
        build_bmi_path = cmEscape(*m);
      }

      for (auto const& exp : exports) {
        std::string iface_source;
        if (exp.second->Install && file_set.Destination) {
          auto dest = install_destination(*file_set.Destination);
          iface_source = cmStrCat(
            dest.second, '/', cmEscape(file_set.RelativeDirectory),
            cmEscape(cmSystemTools::GetFilenameName(file_set.SourcePath)));
        } else {
          iface_source = cmEscape(file_set.SourcePath);
        }

        std::string bmi_path;
        if (exp.second->Install && export_info.BmiInstallation) {
          bmi_path = install_bmi_path;
        } else if (!exp.second->Install) {
          bmi_path = build_bmi_path;
        }

        if (iface_source.empty()) {
          // No destination for the C++ module source; ignore this property
          // value.
          continue;
        }

        *exp.first << "    \"" << cmEscape(p.LogicalName) << '='
                   << iface_source;
        if (!bmi_path.empty()) {
          *exp.first << ',' << bmi_path;
        }
        *exp.first << "\"\n";
      }

      if (bmi_install_script) {
        auto const& bmi_install = *export_info.BmiInstallation;

        *bmi_install_script << "if (CMAKE_INSTALL_COMPONENT STREQUAL \""
                            << cmEscape(bmi_install.Component) << '\"';
        if (!bmi_install.ExcludeFromAll) {
          *bmi_install_script << " OR NOT CMAKE_INSTALL_COMPONENT";
        }
        *bmi_install_script << ")\n";
        *bmi_install_script << "  file(INSTALL\n"
                               "    DESTINATION \"";
        if (!bmi_dest_is_abs) {
          *bmi_install_script << "${CMAKE_INSTALL_PREFIX}/";
        }
        *bmi_install_script << cmEscape(bmi_install.Destination)
                            << "\"\n"
                               "    TYPE FILE\n";
        if (bmi_install.Optional) {
          *bmi_install_script << "    OPTIONAL\n";
        }
        if (!bmi_install.MessageLevel.empty()) {
          *bmi_install_script << "    " << bmi_install.MessageLevel << "\n";
        }
        if (!bmi_install.Permissions.empty()) {
          *bmi_install_script << "    PERMISSIONS" << bmi_install.Permissions
                              << "\n";
        }
        *bmi_install_script << "    FILES \"" << *m << "\")\n";
        if (bmi_dest_is_abs) {
          *bmi_install_script
            << "  list(APPEND CMAKE_ABSOLUTE_DESTINATION_FILES\n"
               "    \""
            << cmEscape(cmSystemTools::GetFilenameName(*m))
            << "\")\n"
               "  if (CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(WARNING\n"
               "      \"ABSOLUTE path INSTALL DESTINATION : "
               "${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n"
               "  if (CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION)\n"
               "    message(FATAL_ERROR\n"
               "      \"ABSOLUTE path INSTALL DESTINATION forbidden (by "
               "caller): ${CMAKE_ABSOLUTE_DESTINATION_FILES}\")\n"
               "  endif ()\n";
        }
        *bmi_install_script << "endif ()\n";
      }
    }
  }

  // Add trailing parenthesis for the `set_property` call.
  for (auto const& exp : exports) {
    *exp.first << ")\n";
  }

  // Check that public sources only require public modules.
  for (auto const& pub_reqs : public_source_requires) {
    for (auto const& req : pub_reqs.second) {
      if (private_modules.count(req)) {
        cmSystemTools::Error(cmStrCat(
          "Public C++ module source `", pub_reqs.first, "` requires the `",
          req, "` C++ module which is provided by a private source"));
        result = false;
      }
    }
  }

  return result;
}